

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_>::Stack
          (Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_> *this,
          Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_> *s)

{
  size_t sVar1;
  BottomFirstIterator it;
  pair<Kernel::TermList,_Kernel::RationalConstantType> *ppVar2;
  ulong uVar3;
  
  sVar1 = s->_capacity;
  this->_capacity = sVar1;
  if (sVar1 == 0) {
    ppVar2 = (pair<Kernel::TermList,_Kernel::RationalConstantType> *)0x0;
  }
  else {
    uVar3 = sVar1 * 0x28 + 0xf & 0xfffffffffffffff0;
    if (uVar3 == 0) {
      ppVar2 = (pair<Kernel::TermList,_Kernel::RationalConstantType> *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar3 < 0x11) {
      ppVar2 = (pair<Kernel::TermList,_Kernel::RationalConstantType> *)
               FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar3 < 0x19) {
      ppVar2 = (pair<Kernel::TermList,_Kernel::RationalConstantType> *)
               FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar3 < 0x21) {
      ppVar2 = (pair<Kernel::TermList,_Kernel::RationalConstantType> *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar3 < 0x31) {
      ppVar2 = (pair<Kernel::TermList,_Kernel::RationalConstantType> *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar3 < 0x41) {
      ppVar2 = (pair<Kernel::TermList,_Kernel::RationalConstantType> *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      ppVar2 = (pair<Kernel::TermList,_Kernel::RationalConstantType> *)::operator_new(uVar3,0x10);
    }
  }
  this->_stack = ppVar2;
  this->_cursor = ppVar2;
  this->_end = ppVar2 + this->_capacity;
  it._pointer = s->_stack;
  it._afterLast = s->_cursor;
  Stack<std::pair<Kernel::TermList,Kernel::RationalConstantType>>::
  loadFromIterator<Lib::Stack<std::pair<Kernel::TermList,Kernel::RationalConstantType>>::BottomFirstIterator>
            ((Stack<std::pair<Kernel::TermList,Kernel::RationalConstantType>> *)this,it);
  return;
}

Assistant:

Stack(const Stack& s)
   : _capacity(s._capacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = 0;
    }
    _cursor = _stack;
    _end = _stack+_capacity;

    loadFromIterator(BottomFirstIterator(const_cast<Stack&>(s)));
  }